

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

_Bool new_player_spot(chunk_conflict *c,player *p)

{
  loc_conflict grid_00;
  _Bool _Var1;
  loc_conflict local_28;
  loc grid;
  player *p_local;
  chunk_conflict *c_local;
  
  grid = (loc)p;
  if (((((p->opts).opt[0x2a] & 1U) == 0) ||
      (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y,
      _Var1 = square_in_bounds_fully((chunk *)c,grid_00), !_Var1)) ||
     (_Var1 = square_isstairs((chunk *)c,*(loc_conflict *)((long)grid + 0x10)), !_Var1)) {
    _Var1 = find_start(c,(loc *)&local_28);
    if (!_Var1) {
      msg("Failed to place player; please report.  Restarting generation.");
      dump_level_simple((char *)0x0,"Player Placement Failure",c);
      return false;
    }
  }
  else {
    local_28 = *(loc_conflict *)((long)grid + 0x10);
  }
  if ((*(byte *)((long)grid + 0x1d4) & 1) != 0) {
    if (*(wchar_t *)(*(long *)((long)grid + 0x4c0) + 0x50) == FEAT_MORE) {
      square_set_feat((chunk *)c,local_28,FEAT_MORE);
    }
    else if (*(wchar_t *)(*(long *)((long)grid + 0x4c0) + 0x50) == FEAT_LESS) {
      square_set_feat((chunk *)c,local_28,FEAT_LESS);
    }
  }
  player_place((chunk_conflict1 *)c,(player *)grid,(loc)local_28);
  return true;
}

Assistant:

bool new_player_spot(struct chunk *c, struct player *p)
{
	struct loc grid;

	/* Try to find a good place to put the player */
	if (OPT(p, birth_levels_persist) &&
			square_in_bounds_fully(c, p->grid) &&
			square_isstairs(c, p->grid)) {
		grid = p->grid;
	} else if (!find_start(c, &grid)) {
		msg("Failed to place player; please report.  Restarting generation.");
		dump_level_simple(NULL, "Player Placement Failure", c);
		return false;
	}

	/* Create stairs the player came down if allowed and necessary */
	if (!OPT(p, birth_connect_stairs))
		;
	else if (p->upkeep->create_stair == FEAT_MORE)
		square_set_feat(c, grid, FEAT_MORE);
	else if (p->upkeep->create_stair == FEAT_LESS)
		square_set_feat(c, grid, FEAT_LESS);

	player_place(c, p, grid);
	return true;
}